

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::UniformLocNegativeCompileNonNumberLiteral::Run
          (UniformLocNegativeCompileNonNumberLiteral *this)

{
  long lVar1;
  string local_68;
  allocator<char> local_31;
  string local_30 [8];
  string def;
  UniformLocNegativeCompileNonNumberLiteral *this_local;
  
  def.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"layout (location = x) uniform float u0;",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::__cxx11::string::string((string *)&local_68,local_30);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeCompile
                    (&this->super_ExplicitUniformLocationCaseBase,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string(local_30);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		std::string def = "layout (location = x) uniform float u0;";
		return doRunNegativeCompile(def);
	}